

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtbl.c
# Opt level: O3

cf_void_t hashtbl_remove_node(cf_hashtbl_t *tbl,cf_void_t *key,cf_size_t len)

{
  hashtbl_node_t **pphVar1;
  hashtbl_node_t *phVar2;
  hashtbl_node_t *phVar3;
  byte bVar4;
  int iVar5;
  cf_size_t cVar6;
  hashtbl_node_t *__ptr;
  hashtbl_node **pphVar7;
  hashtbl_node_t *phVar8;
  uint uVar9;
  
  if (len == 0xffffffffffffffff) {
    bVar4 = *key;
    if (bVar4 == 0) {
      uVar9 = 0;
      len = 1;
    }
    else {
      uVar9 = 0;
      len = 1;
      do {
        uVar9 = uVar9 * 0x21 + (uint)bVar4;
        bVar4 = *(byte *)((long)key + len);
        len = len + 1;
      } while (bVar4 != 0);
    }
  }
  else if (len == 0) {
    len = 0;
    uVar9 = 0;
  }
  else {
    cVar6 = 0;
    uVar9 = 0;
    do {
      uVar9 = (uint)*(byte *)((long)key + cVar6) + uVar9 * 0x21;
      cVar6 = cVar6 + 1;
    } while (len != cVar6);
  }
  uVar9 = uVar9 & tbl->hashmsk;
  pphVar1 = tbl->table;
  phVar2 = pphVar1[uVar9];
  if (phVar2 != (hashtbl_node_t *)0x0) {
    phVar3 = phVar2;
    phVar8 = (hashtbl_node_t *)0x0;
    do {
      __ptr = phVar3;
      if ((((__ptr->hash == uVar9) && (__ptr->keylen == len)) && (__ptr->key != (void *)0x0)) &&
         (iVar5 = bcmp(__ptr->key,key,len), iVar5 == 0)) {
        pphVar7 = &phVar8->next;
        if (phVar2 == __ptr) {
          pphVar7 = pphVar1 + uVar9;
        }
        *pphVar7 = __ptr->next;
        if (tbl->callback != (cf_hashtbl_cb_f)0x0) {
          (*tbl->callback)(__ptr->value);
        }
        free(__ptr->key);
        free(__ptr);
        tbl->size = tbl->size - 1;
        return;
      }
      phVar3 = __ptr->next;
      phVar8 = __ptr;
    } while (__ptr->next != (hashtbl_node *)0x0);
  }
  return;
}

Assistant:

cf_void_t hashtbl_remove_node(cf_hashtbl_t* tbl, const cf_void_t* key, cf_size_t len) {
    cf_uint32_t hash = 0;
    hashtbl_node_t* node = CF_NULL_PTR, **list_entry = CF_NULL_PTR, *prev = CF_NULL_PTR;

    hash = cf_hashtbl_calc_hash(key, &len) & tbl->hashmsk;

    for (list_entry = &tbl->table[hash], node = *list_entry;
         node;
         prev = node, node = node->next) {
        if (node->hash == hash && node->keylen == len
            && node->key != CF_NULL_PTR && memcmp(node->key, key, len) == 0) {
            if (*list_entry == node) {
                *list_entry = node->next;
            } else {
                prev->next = node->next;   
            }
            if (tbl->callback) {
                tbl->callback(node->value);
            }
            cf_free_native(node->key);
            cf_free_native(node);

            tbl->size--;
            return;
        }
    }
}